

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O1

bool __thiscall glslang::TPpContext::TokenStream::peekUntokenizedPasting(TokenStream *this)

{
  ulong uVar1;
  pointer pTVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pTVar5;
  bool bVar6;
  
  uVar1 = this->currentPos;
  pTVar2 = (this->stream).
           super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
           .
           super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->stream).
                 super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                 .
                 super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
          0x6db6db6db6db6db7;
  bVar6 = uVar1 < uVar3;
  if (bVar6) {
    uVar4 = uVar1;
    if (pTVar2[uVar1].atom == 0x20) {
      pTVar5 = pTVar2 + uVar1;
      do {
        uVar4 = uVar4 + 1;
        pTVar5 = pTVar5 + 1;
        if (uVar3 - uVar4 == 0) {
          this->currentPos = uVar4;
          goto LAB_0044a451;
        }
      } while (pTVar5->atom == 0x20);
      this->currentPos = uVar4;
      bVar6 = uVar4 < uVar3;
    }
    if ((bVar6) && (pTVar2[uVar4].atom == 0x23)) {
      uVar4 = uVar4 + 1;
      this->currentPos = uVar4;
      if (uVar4 < uVar3) {
        bVar6 = pTVar2[uVar4].atom == 0x23;
        goto LAB_0044a453;
      }
    }
  }
LAB_0044a451:
  bVar6 = false;
LAB_0044a453:
  this->currentPos = uVar1;
  return bVar6;
}

Assistant:

bool TPpContext::TokenStream::peekUntokenizedPasting()
{
    // don't return early, have to restore this
    size_t savePos = currentPos;

    // skip white-space
    while (peekToken(' '))
        ++currentPos;

    // check for ##
    bool pasting = false;
    if (peekToken('#')) {
        ++currentPos;
        if (peekToken('#'))
            pasting = true;
    }

    currentPos = savePos;

    return pasting;
}